

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall dg::debug::DG2Dot<dg::LLVMNode>::dump_edges(DG2Dot<dg::LLVMNode> *this)

{
  bool bVar1;
  element_type *this_00;
  value_type *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_bool>
  pVar2;
  int in_stack_00000014;
  LLVMNode *in_stack_00000018;
  DG2Dot<dg::LLVMNode> *in_stack_00000020;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I_1;
  iterator __end0_1;
  iterator __begin0_1;
  element_type *__range4;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I;
  iterator __end0;
  iterator __begin0;
  DependenceGraph<dg::LLVMNode> *__range3;
  DependenceGraph<dg::LLVMNode> *in_stack_ffffffffffffff48;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *in_stack_ffffffffffffff50;
  __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_01;
  set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
  *in_stack_ffffffffffffff70;
  _Self local_88;
  _Self local_80 [3];
  map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
  *local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  element_type *local_40;
  _Base_ptr local_38;
  undefined1 local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  value_type local_10;
  
  local_10 = in_RDI[0x12];
  local_18._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::begin(in_stack_ffffffffffffff48);
  local_20._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::end(in_stack_ffffffffffffff48);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    local_28 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                         ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                          0x1c91dd);
    dump_node_edges(in_stack_00000020,in_stack_00000018,in_stack_00000014);
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
              (in_stack_ffffffffffffff50);
  }
  this_01 = &local_50;
  DependenceGraph<dg::LLVMNode>::getGlobalNodes(in_stack_ffffffffffffff48);
  local_40 = std::
             __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ::get(this_01);
  pVar2 = std::
          set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
          ::insert(in_stack_ffffffffffffff70,in_RDI);
  local_60 = (_Base_ptr)pVar2.first._M_node;
  local_58 = pVar2.second;
  local_38 = local_60;
  local_30 = local_58;
  std::
  shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
  ::~shared_ptr((shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
                 *)0x1c928a);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    DependenceGraph<dg::LLVMNode>::getGlobalNodes(in_stack_ffffffffffffff48);
    this_00 = std::
              __shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_01);
    std::
    shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
                   *)0x1c92c4);
    local_68 = this_00;
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::begin(this_00);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::end(this_00);
    while (bVar1 = std::operator!=(local_80,&local_88), bVar1) {
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)0x1c930a);
      dump_node_edges(in_stack_00000020,in_stack_00000018,in_stack_00000014);
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)this_01);
    }
  }
  return;
}

Assistant:

void dump_edges() {
        for (auto &I : *dg) {
            dump_node_edges(I.second);
        }

        if (dumpedGlobals.insert(dg->getGlobalNodes().get()).second)
            for (auto &I : *dg->getGlobalNodes())
                dump_node_edges(I.second);
    }